

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void kj::(anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
               (EncodingResult<kj::Array<char16_t>_> *result,char16_t (*expected) [4],bool errors)

{
  char16_t *pcVar1;
  size_t sVar2;
  undefined7 in_register_00000011;
  bool in_R8B;
  ArrayPtr<const_char16_t> expected_00;
  char16_t *local_28;
  size_t sStack_20;
  ArrayDisposer *local_18;
  undefined1 local_10;
  
  expected_00.size_ = CONCAT71(in_register_00000011,errors) & 0xffffffff;
  local_28 = (result->super_Array<char16_t>).ptr;
  sStack_20 = (result->super_Array<char16_t>).size_;
  local_18 = (result->super_Array<char16_t>).disposer;
  (result->super_Array<char16_t>).ptr = (char16_t *)0x0;
  (result->super_Array<char16_t>).size_ = 0;
  local_10 = result->hadErrors;
  expected_00.ptr = (char16_t *)0x3;
  expectResImpl<kj::Array<char16_t>,char16_t>
            ((_anonymous_namespace_ *)&local_28,(EncodingResult<kj::Array<char16_t>_> *)expected,
             expected_00,in_R8B);
  sVar2 = sStack_20;
  pcVar1 = local_28;
  if (local_28 != (char16_t *)0x0) {
    local_28 = (char16_t *)0x0;
    sStack_20 = 0;
    (**local_18->_vptr_ArrayDisposer)(local_18,pcVar1,2,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               const U (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr(expected, s - 1), errors);
}